

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1329af::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody
          (DebugCounterTest_RealProvidesReportAtExit_Test *this)

{
  DeathTest *pDVar1;
  DeathTest *pDVar2;
  bool bVar3;
  int iVar4;
  char *message;
  DeathTest DVar5;
  bool expect_output;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  Message local_80 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    ::(anonymous_namespace)::MatchOutput_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_60,(_anonymous_namespace_ *)0x1,expect_output);
    local_48.vtable_ = local_60.vtable_;
    local_60.vtable_ = (VTable *)0x0;
    local_48.buffer_ = local_60.buffer_;
    local_48.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_015ec2c8;
    bVar3 = testing::internal::DeathTest::Create
                      ("{ static google::protobuf::internal::RealDebugCounter counter1(\"Foo.Bar\"); static google::protobuf::internal::RealDebugCounter counter2(\"Foo.Baz\"); static google::protobuf::internal::RealDebugCounter counter3(\"Num.32\"); static google::protobuf::internal::RealDebugCounter counter4(\"Num.128\"); counter1.Inc(); counter2.Inc(); counter2.Inc(); counter3.Inc(); counter3.Inc(); counter3.Inc(); counter4.Inc(); exit(0); }"
                       ,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                         *)&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
                       ,0x39,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_60);
    pDVar1 = gtest_dt;
    if (bVar3) {
      if (gtest_dt == (DeathTest *)0x0) {
        return;
      }
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])();
      pDVar2 = gtest_dt;
      if (iVar4 == 0) {
        testing::ExitedWithCode::ExitedWithCode((ExitedWithCode *)local_80,0);
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])();
        bVar3 = testing::ExitedWithCode::operator()((ExitedWithCode *)local_80,iVar4);
        iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (*pDVar1->_vptr_DeathTest[1])(pDVar1);
          goto LAB_0043d176;
        }
      }
      else if (iVar4 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::
               counter1 == '\0') && (iVar4 = __cxa_guard_acquire(), iVar4 != 0)) {
            name._M_str = "Foo.Bar";
            name._M_len = 7;
            google::protobuf::internal::RealDebugCounter::RealDebugCounter(&TestBody::counter1,name)
            ;
            __cxa_guard_release();
          }
          if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::
               counter2 == '\0') && (iVar4 = __cxa_guard_acquire(), iVar4 != 0)) {
            name_00._M_str = "Foo.Baz";
            name_00._M_len = 7;
            google::protobuf::internal::RealDebugCounter::RealDebugCounter
                      (&TestBody::counter2,name_00);
            __cxa_guard_release();
          }
          if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::
               counter3 == '\0') && (iVar4 = __cxa_guard_acquire(), iVar4 != 0)) {
            name_01._M_str = "Num.32";
            name_01._M_len = 6;
            google::protobuf::internal::RealDebugCounter::RealDebugCounter
                      (&TestBody::counter3,name_01);
            __cxa_guard_release();
          }
          if ((::(anonymous_namespace)::DebugCounterTest_RealProvidesReportAtExit_Test::TestBody()::
               counter4 == '\0') && (iVar4 = __cxa_guard_acquire(), iVar4 != 0)) {
            name_02._M_str = "Num.128";
            name_02._M_len = 7;
            google::protobuf::internal::RealDebugCounter::RealDebugCounter
                      (&TestBody::counter4,name_02);
            __cxa_guard_release();
          }
          TestBody::counter1.counter_.super___atomic_base<unsigned_long>._M_i =
               (atomic<unsigned_long>)
               ((long)TestBody::counter1.counter_.super___atomic_base<unsigned_long>._M_i + 1);
          TestBody::counter2.counter_.super___atomic_base<unsigned_long>._M_i =
               (atomic<unsigned_long>)
               ((long)TestBody::counter2.counter_.super___atomic_base<unsigned_long>._M_i + 2);
          TestBody::counter3.counter_.super___atomic_base<unsigned_long>._M_i =
               (atomic<unsigned_long>)
               ((long)TestBody::counter3.counter_.super___atomic_base<unsigned_long>._M_i + 3);
          TestBody::counter4.counter_.super___atomic_base<unsigned_long>._M_i =
               (atomic<unsigned_long>)
               ((long)TestBody::counter4.counter_.super___atomic_base<unsigned_long>._M_i + 1);
          exit(0);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)pDVar1->_vptr_DeathTest;
      local_80[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )pDVar1;
      goto LAB_0043d1c5;
    }
  }
LAB_0043d176:
  testing::Message::Message(local_80);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_dt,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/debug_counter_test.cc"
             ,0x39,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,local_80);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
  if (local_80[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl ==
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    return;
  }
  DVar5._vptr_DeathTest =
       *(_func_int ***)
        local_80[0].ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl;
LAB_0043d1c5:
  (*DVar5._vptr_DeathTest[1])
            (local_80[0].ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  return;
}

Assistant:

TEST(DebugCounterTest, RealProvidesReportAtExit) {
  EXPECT_EXIT(
      {
        static google::protobuf::internal::RealDebugCounter counter1("Foo.Bar");
        static google::protobuf::internal::RealDebugCounter counter2("Foo.Baz");
        static google::protobuf::internal::RealDebugCounter counter3("Num.32");
        static google::protobuf::internal::RealDebugCounter counter4("Num.128");
        counter1.Inc();
        counter2.Inc();
        counter2.Inc();
        counter3.Inc();
        counter3.Inc();
        counter3.Inc();
        counter4.Inc();
        exit(0);
      },
      ExitedWithCode(0), MatchOutput(true));
}